

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsData.cpp
# Opt level: O2

int helicsDataBufferStringSize(HelicsDataBuffer data)

{
  DataType DVar1;
  SmallBuffer *pSVar2;
  size_t sVar3;
  int iVar4;
  data_view local_48;
  string v;
  
  pSVar2 = getBuffer(data);
  if (pSVar2 == (SmallBuffer *)0x0) {
    iVar4 = 0;
  }
  else {
    DVar1 = helics::detail::detectType(pSVar2->heap);
    if (DVar1 == HELICS_UNKNOWN) {
      iVar4 = (int)pSVar2->bufferSize;
    }
    else if (DVar1 == HELICS_CHAR) {
      iVar4 = 1;
    }
    else if (DVar1 == HELICS_STRING) {
      sVar3 = helics::detail::getDataSize(pSVar2->heap);
      iVar4 = (int)sVar3 + 1;
    }
    else {
      v._M_dataplus._M_p = (pointer)&v.field_2;
      v._M_string_length = 0;
      v.field_2._M_local_buf[0] = '\0';
      local_48.dblock._M_len = pSVar2->bufferSize;
      local_48.dblock._M_str = (char *)pSVar2->heap;
      local_48.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>._M_ptr
           = (element_type *)0x0;
      local_48.ref.super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      DVar1 = helics::detail::detectType((byte *)local_48.dblock._M_str);
      helics::valueExtract(&local_48,DVar1,&v);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&local_48.ref.
                  super___shared_ptr<const_helics::SmallBuffer,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      iVar4 = (int)v._M_string_length + 1;
      std::__cxx11::string::~string((string *)&v);
    }
  }
  return iVar4;
}

Assistant:

int helicsDataBufferStringSize(HelicsDataBuffer data)
{
    auto* ptr = getBuffer(data);
    if (ptr == nullptr) {
        return 0;
    }
    switch (helics::detail::detectType(ptr->data())) {
        case helics::DataType::HELICS_STRING:
            return static_cast<int>(helics::detail::getDataSize(ptr->data())) + 1;
        case helics::DataType::HELICS_CHAR:
            return 1;
        case helics::DataType::HELICS_UNKNOWN:
            return static_cast<int>(ptr->size());
        default: {
            std::string v;
            helics::valueExtract(helics::data_view(*ptr), helics::detail::detectType(ptr->data()), v);
            return static_cast<int>(v.size()) + 1;
        } break;
    }
}